

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogg_tools.cxx
# Opt level: O0

void __thiscall ogg_tools::process(ogg_tools *this,cl_parser *cl)

{
  bool bVar1;
  char *pcVar2;
  allocator<char> local_41;
  string local_40;
  xr_file_system *local_20;
  xr_file_system *fs;
  cl_parser *cl_local;
  ogg_tools *this_local;
  
  fs = (xr_file_system *)cl;
  cl_local = (cl_parser *)this;
  bVar1 = check_paths(this);
  if (bVar1) {
    local_20 = xray_re::xr_file_system::instance();
    pcVar2 = xray_re::xr_file_system::resolve_path(local_20,"$game_sounds$");
    std::__cxx11::string::operator=((string *)&this->m_sounds,pcVar2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
    process_folder(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return;
}

Assistant:

void ogg_tools::process(const cl_parser& cl)
{
	if (!check_paths())
		return;

	xr_file_system& fs = xr_file_system::instance();
	m_sounds = fs.resolve_path(PA_GAME_SOUNDS);

	process_folder();
}